

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O0

bool spirv_cross::is_reserved_identifier(string *name,bool member,bool allow_reserved_prefixes)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  size_t sVar5;
  bool local_69;
  bool local_59;
  bool local_49;
  bool local_31;
  ulong local_30;
  size_t index_1;
  size_t index;
  bool allow_reserved_prefixes_local;
  bool member_local;
  string *name_local;
  
  if ((allow_reserved_prefixes) || (bVar1 = is_reserved_prefix(name), !bVar1)) {
    if (member) {
      uVar3 = ::std::__cxx11::string::size();
      if (uVar3 < 3) {
        name_local._7_1_ = false;
      }
      else {
        iVar2 = ::std::__cxx11::string::compare((ulong)name,0,(char *)0x2,0x4217b5);
        if (iVar2 == 0) {
          index_1 = 2;
          while( true ) {
            uVar3 = ::std::__cxx11::string::size();
            local_31 = false;
            if (index_1 < uVar3) {
              pcVar4 = (char *)::std::__cxx11::string::operator[]((ulong)name);
              local_31 = is_numeric(*pcVar4);
            }
            if (local_31 == false) break;
            index_1 = index_1 + 1;
          }
          sVar5 = ::std::__cxx11::string::size();
          name_local._7_1_ = index_1 == sVar5;
        }
        else {
          name_local._7_1_ = false;
        }
      }
    }
    else {
      uVar3 = ::std::__cxx11::string::size();
      if (uVar3 < 2) {
        name_local._7_1_ = false;
      }
      else {
        pcVar4 = (char *)::std::__cxx11::string::operator[]((ulong)name);
        if (*pcVar4 == '_') {
          pcVar4 = (char *)::std::__cxx11::string::operator[]((ulong)name);
          bVar1 = is_numeric(*pcVar4);
          if (bVar1) {
            local_30 = 2;
            while( true ) {
              uVar3 = ::std::__cxx11::string::size();
              local_49 = false;
              if (local_30 < uVar3) {
                pcVar4 = (char *)::std::__cxx11::string::operator[]((ulong)name);
                local_49 = is_numeric(*pcVar4);
              }
              if (local_49 == false) break;
              local_30 = local_30 + 1;
            }
            uVar3 = ::std::__cxx11::string::size();
            local_59 = true;
            if (local_30 != uVar3) {
              uVar3 = ::std::__cxx11::string::size();
              local_69 = false;
              if (local_30 < uVar3) {
                pcVar4 = (char *)::std::__cxx11::string::operator[]((ulong)name);
                local_69 = *pcVar4 == '_';
              }
              local_59 = local_69;
            }
            return local_59;
          }
        }
        name_local._7_1_ = false;
      }
    }
  }
  else {
    name_local._7_1_ = true;
  }
  return name_local._7_1_;
}

Assistant:

static bool is_reserved_identifier(const string &name, bool member, bool allow_reserved_prefixes)
{
	if (!allow_reserved_prefixes && is_reserved_prefix(name))
		return true;

	if (member)
	{
		// Reserved member identifiers come in one form:
		// _m[0-9]+$.
		if (name.size() < 3)
			return false;

		if (name.compare(0, 2, "_m", 2) != 0)
			return false;

		size_t index = 2;
		while (index < name.size() && is_numeric(name[index]))
			index++;

		return index == name.size();
	}
	else
	{
		// Reserved non-member identifiers come in two forms:
		// _[0-9]+$, used for temporaries which map directly to a SPIR-V ID.
		// _[0-9]+_, used for auxillary temporaries which derived from a SPIR-V ID.
		if (name.size() < 2)
			return false;

		if (name[0] != '_' || !is_numeric(name[1]))
			return false;

		size_t index = 2;
		while (index < name.size() && is_numeric(name[index]))
			index++;

		return index == name.size() || (index < name.size() && name[index] == '_');
	}
}